

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multiqueues.h
# Opt level: O2

void __thiscall
Multiqueues<int>::Multiqueues(Multiqueues<int> *this,int numOfThreads,int numOfQueuesPerThread)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint *puVar3;
  id *__s;
  ulong uVar4;
  ulong *puVar5;
  ulong *puVar6;
  mutex *__s_00;
  ulong uVar7;
  long lVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  
  this->numOfQueues = 2;
  puVar3 = (uint *)operator_new__(4);
  this->seed = puVar3;
  this->threadsMapSize = 0;
  this->numOfThreads = numOfThreads;
  this->numOfQueuesPerThread = numOfQueuesPerThread;
  iVar9 = numOfQueuesPerThread * numOfThreads;
  this->numOfQueues = iVar9;
  uVar7 = 0xffffffffffffffff;
  sVar10 = (long)numOfThreads * 8;
  if (numOfThreads < 0) {
    sVar10 = uVar7;
  }
  __s = (id *)operator_new__(sVar10);
  if (numOfThreads != 0) {
    memset(__s,0,(long)numOfThreads * 8);
  }
  uVar11 = (ulong)iVar9;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar11;
  this->threadsMap = __s;
  uVar4 = SUB168(auVar1 * ZEXT816(0x30),0) | 8;
  if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
    uVar4 = uVar7;
  }
  puVar5 = (ulong *)operator_new__(uVar4);
  *puVar5 = uVar11;
  if (iVar9 != 0) {
    puVar6 = puVar5 + 4;
    lVar8 = uVar11 * 0x30;
    do {
      puVar6[-3] = 0;
      puVar6[-2] = 0;
      puVar6[-1] = 0;
      puVar6[1] = (ulong)puVar6;
      *puVar6 = (ulong)puVar6;
      puVar6[2] = 0;
      puVar6 = puVar6 + 6;
      lVar8 = lVar8 + -0x30;
    } while (lVar8 != 0);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar11;
  this->internalQueues = (PriorityQueue *)(puVar5 + 1);
  if (SUB168(auVar2 * ZEXT816(0x28),8) == 0) {
    uVar7 = SUB168(auVar2 * ZEXT816(0x28),0);
  }
  __s_00 = (mutex *)operator_new__(uVar7);
  if (iVar9 != 0) {
    uVar7 = uVar11 * 0x28 - 0x28;
    memset(__s_00,0,(uVar7 - uVar7 % 0x28) + 0x28);
  }
  this->locks = __s_00;
  return;
}

Assistant:

Multiqueues(int numOfThreads, int numOfQueuesPerThread) {
        this->numOfThreads = numOfThreads;
        this->numOfQueuesPerThread = numOfQueuesPerThread;
        this->numOfQueues = numOfThreads * numOfQueuesPerThread;
        this->threadsMap = new std::thread::id[numOfThreads];
        internalQueues = new PriorityQueue[numOfQueues];
        locks = new std::mutex[numOfQueues];
    }